

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_flags_decoder.c
# Opt level: O0

_Bool stream_flags_decode(lzma_stream_flags *options,uint8_t *in)

{
  uint8_t *in_local;
  lzma_stream_flags *options_local;
  
  if ((*in == '\0') && ((in[1] & 0xf0) == 0)) {
    options->version = 0;
    options->check = in[1] & 0xf;
    options_local._7_1_ = false;
  }
  else {
    options_local._7_1_ = true;
  }
  return options_local._7_1_;
}

Assistant:

static bool
stream_flags_decode(lzma_stream_flags *options, const uint8_t *in)
{
	// Reserved bits must be unset.
	if (in[0] != 0x00 || (in[1] & 0xF0))
		return true;

	options->version = 0;
	options->check = in[1] & 0x0F;

	return false;
}